

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[12],pstack::Elf::SymbolVersioning,char>
          (JObject *this,char (*k) [12],SymbolVersioning *v,char *c)

{
  ostream *os;
  JSON<pstack::Field<char[12],_pstack::Elf::SymbolVersioning>,_char> local_48;
  undefined1 local_38 [8];
  Field<char[12],_pstack::Elf::SymbolVersioning> field;
  char *c_local;
  SymbolVersioning *v_local;
  char (*k_local) [12];
  JObject *this_local;
  
  field.v = (SymbolVersioning *)c;
  Field<char[12],_pstack::Elf::SymbolVersioning>::Field
            ((Field<char[12],_pstack::Elf::SymbolVersioning> *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[12],pstack::Elf::SymbolVersioning>,char>
                       ((Field<char[12],_pstack::Elf::SymbolVersioning> *)local_38,(char *)field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }